

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O3

void __thiscall
IO::writeHomotetramers
          (IO *this,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *homotetramer_arr
          ,string *filename)

{
  float fVar1;
  pointer paVar2;
  ostream *poVar3;
  pointer paVar4;
  float fVar5;
  ofstream outstream;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream((string *)&local_228);
  std::ofstream::open((string *)&local_228,(_Ios_Openmode)filename);
  paVar2 = (homotetramer_arr->
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (paVar4 = (homotetramer_arr->
                super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                )._M_impl.super__Vector_impl_data._M_start; paVar4 != paVar2; paVar4 = paVar4 + 1) {
    fVar1 = paVar4->_M_elems[1];
    fVar5 = paVar4->_M_elems[0] + fVar1;
    poVar3 = std::ostream::_M_insert<double>((double)(paVar4->_M_elems[0] / fVar5));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
    poVar3 = std::ostream::_M_insert<double>((double)(fVar1 / fVar5));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void IO::writeHomotetramers(std::vector<std::array<float, 2>> homotetramer_arr, std::string filename) {
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (auto timestep: homotetramer_arr){
		outstream << timestep.at(0)/(timestep.at(0)+timestep.at(1)) << "\t"
						 << timestep.at(1)/(timestep.at(0)+timestep.at(1)) << std::endl;
	}
	outstream.close();
}